

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RazorAHRS.cpp
# Opt level: O3

void * RazorAHRSThread(void *pParam)

{
  ulong uVar1;
  double dVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  bool bVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  interval *piVar10;
  size_t sVar11;
  ulong uVar12;
  SOCKET SVar13;
  char *pcVar14;
  RAZORAHRSDATA razorahrsdata;
  CHRONO chrono_period;
  RAZORAHRS razorahrs;
  char szTemp [256];
  char szSaveFilePath [256];
  double local_a20;
  int local_a14;
  double local_a10;
  int local_a04;
  interval local_a00;
  RAZORAHRSDATA local_9e8;
  timespec local_980;
  double local_970;
  double dStack_968;
  double local_960;
  double dStack_958;
  timespec local_950;
  int local_940;
  timeval local_938;
  interval local_928;
  interval local_910;
  RAZORAHRS local_8f8;
  char local_238 [256];
  char local_138 [264];
  
  memset(&local_8f8,0,0x6c0);
  local_938.tv_sec = 0;
  local_938.tv_usec = 0;
  local_9e8.yaw = 0.0;
  local_9e8.pitch = 0.0;
  local_9e8.roll = 0.0;
  local_9e8.accx = 0.0;
  local_9e8.accy = 0.0;
  local_9e8.accz = 0.0;
  local_9e8.gyrx = 0.0;
  local_9e8.gyry = 0.0;
  local_9e8.gyrz = 0.0;
  local_9e8.Roll = 0.0;
  local_9e8.Pitch = 0.0;
  local_9e8.Yaw = 0.0;
  iVar7 = clock_getres(4,&local_950);
  if ((iVar7 == 0) && (iVar7 = clock_gettime(4,&local_980), iVar7 == 0)) {
    local_940 = 0;
    local_970 = 0.0;
    dStack_968 = 0.0;
    local_960 = 0.0;
    dStack_958 = 0.0;
  }
  local_a14 = 0x32;
  bVar4 = false;
  local_a04 = 0;
  do {
    iVar7 = local_a14 / 1000;
    iVar8 = local_a14 % 1000;
    bVar4 = !bVar4;
    while( true ) {
      if (local_940 == 0) {
        clock_gettime(4,(timespec *)&local_a00);
        local_970 = local_a00.inf;
        dStack_968 = local_a00.sup;
        local_a00.inf =
             (double)((((long)local_a00.inf + (long)local_960) - local_980.tv_sec) +
                     ((long)local_a00.sup + (long)dStack_958) / 1000000000);
        local_a00.sup =
             (double)(((long)local_a00.sup + (long)dStack_958) % 1000000000 - local_980.tv_nsec);
        if ((long)local_a00.sup < 0) {
          local_a00.inf =
               (double)((long)local_a00.inf + ~((ulong)-(long)local_a00.sup / 1000000000));
          local_a00.sup =
               (double)((long)local_a00.sup + 1000000000 +
                       ((ulong)-(long)local_a00.sup / 1000000000) * 1000000000);
        }
        local_960 = local_a00.inf;
        dStack_958 = local_a00.sup;
      }
      iVar9 = clock_getres(4,&local_950);
      if ((iVar9 == 0) && (iVar9 = clock_gettime(4,&local_980), iVar9 == 0)) {
        local_940 = 0;
        local_960 = 0.0;
        dStack_958 = 0.0;
        local_970 = 0.0;
        dStack_968 = 0.0;
      }
      local_a00.inf = (double)(long)iVar7;
      local_a00.sup = (double)(long)(iVar8 * 1000000);
      nanosleep((timespec *)&local_a00,(timespec *)0x0);
      if (bPauseRazorAHRS == 0) break;
      if (!bVar4) {
        puts("RazorAHRS paused.");
        SVar13 = local_8f8.RS232Port.s;
        switch(local_8f8.RS232Port.DevType) {
        case 0:
          iVar9 = (int)local_8f8.RS232Port.hDev;
          goto LAB_001545a6;
        case 1:
        case 3:
          iVar9 = local_8f8.RS232Port.s;
          break;
        case 2:
          shutdown(local_8f8.RS232Port.s,2);
          close(SVar13);
        case 4:
          iVar9 = local_8f8.RS232Port.s_srv;
          break;
        default:
          goto switchD_00154568_default;
        }
        shutdown(iVar9,2);
LAB_001545a6:
        iVar9 = close(iVar9);
        pcVar14 = "RazorAHRS disconnected.";
        if (iVar9 != 0) {
switchD_00154568_default:
          pcVar14 = "RazorAHRS disconnection failed.";
        }
        puts(pcVar14);
      }
      if (bExit != 0) {
        bVar5 = true;
        goto LAB_00154e49;
      }
      local_a00.inf = 0.0;
      local_a00.sup = 4.94065645841247e-316;
      nanosleep((timespec *)&local_a00,(timespec *)0x0);
      bVar4 = true;
    }
    if (bRestartRazorAHRS == 0) {
      if (bVar4) goto LAB_00154bfd;
      iVar7 = GetLatestDataRazorAHRS(&local_8f8,&local_9e8);
      if (iVar7 == 0) {
        iVar7 = gettimeofday(&local_938,(__timezone_ptr_t)0x0);
        if (iVar7 != 0) {
          local_938.tv_sec = 0;
          local_938.tv_usec = 0;
        }
        pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
        dVar2 = fmod(local_9e8.Roll,6.283185307179586);
        local_a20 = fmod(dVar2 + 9.42477796076938,6.283185307179586);
        local_a20 = local_a20 + -3.141592653589793;
        interval::interval(&local_910,&local_a20);
        local_a10 = -phi_ahrs_acc;
        interval::interval(&local_928,&local_a10,&phi_ahrs_acc);
        operator+(&local_910,&local_928);
        interval::operator=((interval *)&phi_ahrs,&local_a00);
        dVar2 = fmod(-local_9e8.Pitch,6.283185307179586);
        local_a20 = fmod(dVar2 + 9.42477796076938,6.283185307179586);
        local_a20 = local_a20 + -3.141592653589793;
        interval::interval(&local_910,&local_a20);
        local_a10 = -theta_ahrs_acc;
        interval::interval(&local_928,&local_a10,&theta_ahrs_acc);
        operator+(&local_910,&local_928);
        interval::operator=((interval *)&theta_ahrs,&local_a00);
        dVar2 = fmod((1.5707963267948966 - local_9e8.Yaw) - angle_env,6.283185307179586);
        local_a20 = fmod(dVar2 + 9.42477796076938,6.283185307179586);
        local_a20 = local_a20 + -3.141592653589793;
        interval::interval(&local_910,&local_a20);
        local_a10 = -psi_ahrs_acc;
        interval::interval(&local_928,&local_a10,&psi_ahrs_acc);
        operator+(&local_910,&local_928);
        piVar10 = interval::operator=((interval *)&psi_ahrs,&local_a00);
        if ((local_8f8.bROSMode != 0) &&
           ((((auVar3._4_4_ = -(uint)(local_9e8.gyry != 0.0),
              auVar3._0_4_ = -(uint)(local_9e8.gyrx != 0.0),
              auVar3._8_4_ = -(uint)(local_9e8.gyrz != 0.0),
              auVar3._12_4_ = -(uint)(local_9e8.accx != 0.0), iVar7 = movmskps((int)piVar10,auVar3),
              iVar7 != 0 || (local_9e8.accy != 0.0)) || (NAN(local_9e8.accy))) ||
            ((local_9e8.accz != 0.0 || (NAN(local_9e8.accz))))))) {
          interval::interval(&local_910,&local_9e8.gyrx);
          local_a20 = -omegax_ahrs_acc;
          interval::interval(&local_928,&local_a20,&omegax_ahrs_acc);
          operator+(&local_910,&local_928);
          interval::operator=((interval *)&omegax_ahrs,&local_a00);
          local_a20 = -local_9e8.gyry;
          interval::interval(&local_910,&local_a20);
          local_a10 = -omegay_ahrs_acc;
          interval::interval(&local_928,&local_a10,&omegay_ahrs_acc);
          operator+(&local_910,&local_928);
          interval::operator=((interval *)&omegay_ahrs,&local_a00);
          local_a20 = -local_9e8.gyrz;
          interval::interval(&local_910,&local_a20);
          local_a10 = -omegaz_ahrs_acc;
          interval::interval(&local_928,&local_a10,&omegaz_ahrs_acc);
          operator+(&local_910,&local_928);
          interval::operator=((interval *)&omegaz_ahrs,&local_a00);
          local_a20 = local_9e8.accx * 9.8 * 0.00390625;
          interval::interval(&local_910,&local_a20);
          local_a10 = -accrx_ahrs_acc;
          interval::interval(&local_928,&local_a10,&accrx_ahrs_acc);
          operator+(&local_910,&local_928);
          interval::operator=((interval *)&accrx_ahrs,&local_a00);
          local_a20 = local_9e8.accy * -9.8 * 0.00390625;
          interval::interval(&local_910,&local_a20);
          local_a10 = -accry_ahrs_acc;
          interval::interval(&local_928,&local_a10,&accry_ahrs_acc);
          operator+(&local_910,&local_928);
          interval::operator=((interval *)&accry_ahrs,&local_a00);
          local_a20 = local_9e8.accz * -9.8 * 0.00390625;
          interval::interval(&local_910,&local_a20);
          local_a10 = -accrz_ahrs_acc;
          interval::interval(&local_928,&local_a10,&accrz_ahrs_acc);
          operator+(&local_910,&local_928);
          interval::operator=((interval *)&accrz_ahrs,&local_a00);
        }
        pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
        goto LAB_00154cfa;
      }
      puts("Connection to a RazorAHRS lost.");
      SVar13 = local_8f8.RS232Port.s;
      iVar7 = local_a04;
      switch(local_8f8.RS232Port.DevType) {
      case 0:
        iVar8 = (int)local_8f8.RS232Port.hDev;
        goto LAB_00154e15;
      case 1:
      case 3:
        iVar8 = local_8f8.RS232Port.s;
        break;
      case 2:
        shutdown(local_8f8.RS232Port.s,2);
        close(SVar13);
      case 4:
        iVar8 = local_8f8.RS232Port.s_srv;
        break;
      default:
        goto switchD_001546b1_default;
      }
      shutdown(iVar8,2);
LAB_00154e15:
      iVar8 = close(iVar8);
      pcVar14 = "RazorAHRS disconnected.";
      if (iVar8 != 0) {
switchD_001546b1_default:
        pcVar14 = "RazorAHRS disconnection failed.";
      }
      puts(pcVar14);
LAB_00154c35:
      if (ExitOnErrorCount <= iVar7 + 1 && 0 < ExitOnErrorCount) {
        bExit = 1;
        bVar5 = true;
        break;
      }
      bVar4 = false;
      bVar5 = true;
      local_a04 = iVar7 + 1;
    }
    else {
      if (!bVar4) {
        puts("Restarting a RazorAHRS.");
        SVar13 = local_8f8.RS232Port.s;
        switch(local_8f8.RS232Port.DevType) {
        case 0:
          iVar7 = (int)local_8f8.RS232Port.hDev;
          goto LAB_00154bd1;
        case 1:
        case 3:
          iVar7 = local_8f8.RS232Port.s;
          break;
        case 2:
          shutdown(local_8f8.RS232Port.s,2);
          close(SVar13);
        case 4:
          iVar7 = local_8f8.RS232Port.s_srv;
          break;
        default:
          goto switchD_00154648_default;
        }
        shutdown(iVar7,2);
LAB_00154bd1:
        iVar7 = close(iVar7);
        pcVar14 = "RazorAHRS disconnected.";
        if (iVar7 != 0) {
switchD_00154648_default:
          pcVar14 = "RazorAHRS disconnection failed.";
        }
        puts(pcVar14);
      }
      bRestartRazorAHRS = 0;
LAB_00154bfd:
      iVar7 = ConnectRazorAHRS(&local_8f8,"RazorAHRS0.txt");
      if (iVar7 != 0) {
        local_a00.inf = 4.94065645841247e-324;
        local_a00.sup = 0.0;
        nanosleep((timespec *)&local_a00,(timespec *)0x0);
        iVar7 = local_a04;
        goto LAB_00154c35;
      }
      local_a14 = local_8f8.threadperiod;
      local_938.tv_sec = 0;
      local_938.tv_usec = 0;
      local_9e8.yaw = 0.0;
      local_9e8.pitch = 0.0;
      local_9e8.roll = 0.0;
      local_9e8.accx = 0.0;
      local_9e8.accy = 0.0;
      local_9e8.accz = 0.0;
      local_9e8.gyrx = 0.0;
      local_9e8.gyry = 0.0;
      local_9e8.gyrz = 0.0;
      local_9e8.Roll = 0.0;
      local_9e8.Pitch = 0.0;
      local_9e8.Yaw = 0.0;
      if ((FILE *)local_8f8.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)local_8f8.pfSaveFile);
        local_8f8.pfSaveFile = (FILE *)0x0;
      }
      bVar4 = true;
      if (local_8f8.bSaveRawData == 0) {
LAB_00154cfa:
        bVar4 = true;
        bVar5 = false;
      }
      else {
        if (local_8f8.szCfgFilePath[0] == '\0') {
          builtin_strncpy(local_238,"razorahrs",10);
        }
        else {
          sprintf(local_238,"%.127s",local_8f8.szCfgFilePath);
        }
        sVar11 = strlen(local_238);
        iVar7 = (int)sVar11 + 1;
        uVar12 = sVar11 & 0xffffffff;
        do {
          if ((int)uVar12 < 1) goto LAB_00154d68;
          uVar1 = uVar12 - 1;
          iVar7 = iVar7 + -1;
          lVar6 = uVar12 - 1;
          uVar12 = uVar1;
        } while (local_238[lVar6] != '.');
        if ((uVar1 != 0) && (iVar7 <= (int)sVar11)) {
          memset(local_238 + (uVar1 & 0xffffffff),0,sVar11 - (uVar1 & 0xffffffff));
        }
LAB_00154d68:
        pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
        pcVar14 = strtimeex_fns();
        bVar5 = false;
        sprintf(local_138,"log/%.127s_%.64s.txt",local_238,pcVar14);
        pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
        local_8f8.pfSaveFile = (FILE *)fopen(local_138,"w");
        if ((FILE *)local_8f8.pfSaveFile == (FILE *)0x0) {
          puts("Unable to create RazorAHRS data file.");
          bVar5 = false;
          break;
        }
      }
    }
  } while (bExit == 0);
LAB_00154e49:
  if (local_940 == 0) {
    clock_gettime(4,(timespec *)&local_a00);
    local_970 = local_a00.inf;
    dStack_968 = local_a00.sup;
    local_a00.inf =
         (double)((((long)local_a00.inf + (long)local_960) - local_980.tv_sec) +
                 ((long)local_a00.sup + (long)dStack_958) / 1000000000);
    local_a00.sup =
         (double)(((long)local_a00.sup + (long)dStack_958) % 1000000000 - local_980.tv_nsec);
    if ((long)local_a00.sup < 0) {
      local_a00.inf = (double)((long)local_a00.inf + ~((ulong)-(long)local_a00.sup / 1000000000));
      local_a00.sup =
           (double)((long)local_a00.sup + 1000000000 +
                   ((ulong)-(long)local_a00.sup / 1000000000) * 1000000000);
    }
    local_960 = local_a00.inf;
    dStack_958 = local_a00.sup;
  }
  if ((FILE *)local_8f8.pfSaveFile != (FILE *)0x0) {
    fclose((FILE *)local_8f8.pfSaveFile);
    local_8f8.pfSaveFile = (FILE *)0x0;
  }
  if (bVar5) goto LAB_00154fb2;
  switch(local_8f8.RS232Port.DevType) {
  case 0:
    goto LAB_00154f92;
  case 1:
  case 3:
    SVar13 = local_8f8.RS232Port.s;
    break;
  case 2:
    shutdown(local_8f8.RS232Port.s,2);
    close(local_8f8.RS232Port.s);
  case 4:
    SVar13 = local_8f8.RS232Port.s_srv;
    break;
  default:
    goto switchD_00154f5a_default;
  }
  shutdown(SVar13,2);
  local_8f8.RS232Port.hDev._0_4_ = SVar13;
LAB_00154f92:
  iVar7 = close((int)local_8f8.RS232Port.hDev);
  if (iVar7 == 0) {
    pcVar14 = "RazorAHRS disconnected.";
  }
  else {
switchD_00154f5a_default:
    pcVar14 = "RazorAHRS disconnection failed.";
  }
  puts(pcVar14);
LAB_00154fb2:
  if (bExit == 0) {
    bExit = 1;
  }
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE RazorAHRSThread(void* pParam)
{
	RAZORAHRS razorahrs;
	struct timeval tv;
	RAZORAHRSDATA razorahrsdata;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 50;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&razorahrs, 0, sizeof(RAZORAHRS));

	memset(&tv, 0, sizeof(tv));
	memset(&razorahrsdata, 0, sizeof(razorahrsdata));

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		mSleep(threadperiod);

		if (bPauseRazorAHRS) 
		{ 
			if (bConnected)
			{
				printf("RazorAHRS paused.\n");
				bConnected = FALSE;
				DisconnectRazorAHRS(&razorahrs);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartRazorAHRS) 
		{ 
			if (bConnected)
			{
				printf("Restarting a RazorAHRS.\n");
				bConnected = FALSE;
				DisconnectRazorAHRS(&razorahrs);
			}
			bRestartRazorAHRS = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectRazorAHRS(&razorahrs, "RazorAHRS0.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = razorahrs.threadperiod;

				memset(&tv, 0, sizeof(tv));
				memset(&razorahrsdata, 0, sizeof(razorahrsdata));

				if (razorahrs.pfSaveFile != NULL)
				{
					fclose(razorahrs.pfSaveFile); 
					razorahrs.pfSaveFile = NULL;
				}
				if ((razorahrs.bSaveRawData)&&(razorahrs.pfSaveFile == NULL)) 
				{
					if (strlen(razorahrs.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", razorahrs.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "razorahrs");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.txt", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					razorahrs.pfSaveFile = fopen(szSaveFilePath, "w");
					if (razorahrs.pfSaveFile == NULL) 
					{
						printf("Unable to create RazorAHRS data file.\n");
						break;
					}
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			if (GetLatestDataRazorAHRS(&razorahrs, &razorahrsdata) == EXIT_SUCCESS)
			{
				if (gettimeofday(&tv, NULL) != EXIT_SUCCESS) { tv.tv_sec = 0; tv.tv_usec = 0; }

				EnterCriticalSection(&StateVariablesCS);

				phi_ahrs = fmod_2PI(razorahrsdata.Roll)+interval(-phi_ahrs_acc, phi_ahrs_acc);
				theta_ahrs = fmod_2PI(-razorahrsdata.Pitch)+interval(-theta_ahrs_acc, theta_ahrs_acc);
				psi_ahrs = fmod_2PI(M_PI/2.0-razorahrsdata.Yaw-angle_env)+interval(-psi_ahrs_acc, psi_ahrs_acc);

				if ((razorahrs.bROSMode)&&
					!((razorahrsdata.gyrx == 0)&&(razorahrsdata.gyry == 0)&&(razorahrsdata.gyrz == 0)&&
					(razorahrsdata.accx == 0)&&(razorahrsdata.accy == 0)&&(razorahrsdata.accz == 0)))
				{
					omegax_ahrs = razorahrsdata.gyrx+interval(-omegax_ahrs_acc, omegax_ahrs_acc);
					omegay_ahrs = -razorahrsdata.gyry+interval(-omegay_ahrs_acc, omegay_ahrs_acc);
					omegaz_ahrs = -razorahrsdata.gyrz+interval(-omegaz_ahrs_acc, omegaz_ahrs_acc);
					accrx_ahrs = razorahrsdata.accx*9.8/256.0+interval(-accrx_ahrs_acc, accrx_ahrs_acc);
					accry_ahrs = -razorahrsdata.accy*9.8/256.0+interval(-accry_ahrs_acc, accry_ahrs_acc);
					accrz_ahrs = -razorahrsdata.accz*9.8/256.0+interval(-accrz_ahrs_acc, accrz_ahrs_acc);
				}

				LeaveCriticalSection(&StateVariablesCS);
			}
			else
			{
				printf("Connection to a RazorAHRS lost.\n");
				bConnected = FALSE;
				DisconnectRazorAHRS(&razorahrs);
			}
		}

		//printf("RazorAHRSThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	StopChronoQuick(&chrono_period);

	if (razorahrs.pfSaveFile != NULL)
	{
		fclose(razorahrs.pfSaveFile); 
		razorahrs.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectRazorAHRS(&razorahrs);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}